

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

real __thiscall
fasttext::SoftmaxLoss::forward
          (SoftmaxLoss *this,vector<int,_std::allocator<int>_> *targets,int32_t targetIndex,
          State *state,real lr,bool backprop)

{
  float fVar1;
  uint uVar2;
  pointer piVar3;
  element_type *peVar4;
  undefined1 auVar5 [16];
  int64_t iVar6;
  ulong i;
  undefined1 auVar7 [16];
  
  (*(this->super_Loss)._vptr_Loss[3])();
  if (targetIndex < 0) {
    __assert_fail("targetIndex >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/loss.cc"
                  ,0x14a,
                  "virtual real fasttext::SoftmaxLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
                 );
  }
  piVar3 = (targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((ulong)(uint)targetIndex <
      (ulong)((long)(targets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
    uVar2 = piVar3[(uint)targetIndex];
    if (backprop) {
      iVar6 = Matrix::size((((this->super_Loss).wo_)->
                           super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                           0);
      for (i = 0; (~((int)(uint)iVar6 >> 0x1f) & (uint)iVar6) != i; i = i + 1) {
        Vector::addRow(&state->grad,
                       (((this->super_Loss).wo_)->
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,i,
                       ((float)((uint)(uVar2 == i) * 0x3f800000) -
                       (state->output).data_.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start[i]) * lr);
        peVar4 = (((this->super_Loss).wo_)->
                 super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (*peVar4->_vptr_Matrix[3])(peVar4,&state->hidden,i);
      }
    }
    fVar1 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar2];
    auVar7 = ZEXT816(0) << 0x40;
    if (fVar1 <= 1.0) {
      auVar7 = ZEXT416((uint)(this->super_Loss).t_log_.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start[(long)(fVar1 * 512.0)]);
    }
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar7,auVar5);
    return auVar7._0_4_;
  }
  __assert_fail("targetIndex < targets.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/loss.cc"
                ,0x14b,
                "virtual real fasttext::SoftmaxLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
               );
}

Assistant:

real SoftmaxLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t targetIndex,
    Model::State& state,
    real lr,
    bool backprop) {
  computeOutput(state);

  assert(targetIndex >= 0);
  assert(targetIndex < targets.size());
  int32_t target = targets[targetIndex];

  if (backprop) {
    int32_t osz = wo_->size(0);
    for (int32_t i = 0; i < osz; i++) {
      real label = (i == target) ? 1.0 : 0.0;
      real alpha = lr * (label - state.output[i]);
      state.grad.addRow(*wo_, i, alpha);
      wo_->addVectorToRow(state.hidden, i, alpha);
    }
  }
  return -log(state.output[target]);
}